

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_square_matrix.h
# Opt level: O0

void __thiscall
sparse_square_matrix<unsigned_char>::set
          (sparse_square_matrix<unsigned_char> *this,uint32_t i,uint32_t j,uchar *value)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  mapped_type *pmVar4;
  ulong local_28;
  uchar *local_20;
  uchar *value_local;
  uint32_t j_local;
  uint32_t i_local;
  sparse_square_matrix<unsigned_char> *this_local;
  
  local_20 = value;
  value_local._0_4_ = j;
  value_local._4_4_ = i;
  _j_local = this;
  if (this->N <= i) {
    __assert_fail("i < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/sparse_square_matrix.h"
                  ,0x2f,
                  "void sparse_square_matrix<unsigned char>::set(uint32_t, uint32_t, const Ty &) [Ty = unsigned char]"
                 );
  }
  if (j < this->N) {
    bVar2 = usingDenseStorage(this);
    if (bVar2) {
      vVar1 = *local_20;
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->denseStorage,
                          (ulong)(value_local._4_4_ * this->N + (uint32_t)value_local));
      *pvVar3 = vVar1;
    }
    else {
      vVar1 = *local_20;
      local_28 = (ulong)(value_local._4_4_ * this->N + (uint32_t)value_local);
      pmVar4 = std::
               unordered_map<unsigned_long,_unsigned_char,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
               ::operator[](&this->sparseStorage,&local_28);
      *pmVar4 = vVar1;
    }
    return;
  }
  __assert_fail("j < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/sparse_square_matrix.h"
                ,0x30,
                "void sparse_square_matrix<unsigned char>::set(uint32_t, uint32_t, const Ty &) [Ty = unsigned char]"
               );
}

Assistant:

void set(uint32_t i, uint32_t j, const Ty& value) {
    assert(i < N);
    assert(j < N);
    if (usingDenseStorage()) {
      denseStorage[i * N + j] = value;
    } else {
      sparseStorage[i * N + j] = value;
    }
  }